

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void nni_http_set_static_header(nng_http *conn,nni_http_header *h,char *key,char *val)

{
  nng_http_req *pnVar1;
  nni_list *local_30;
  nni_list *headers;
  char *val_local;
  char *key_local;
  nni_http_header *h_local;
  nng_http *conn_local;
  
  if ((conn->client & 1U) == 0) {
    pnVar1 = (nng_http_req *)&conn->res;
  }
  else {
    pnVar1 = &conn->req;
  }
  local_30 = &(pnVar1->data).hdrs;
  nni_http_del_header(conn,key);
  nni_list_node_remove(&h->node);
  h->field_0x20 = h->field_0x20 & 0xfb;
  h->field_0x20 = h->field_0x20 & 0xfe | 1;
  h->field_0x20 = h->field_0x20 & 0xfd | 2;
  h->name = key;
  h->value = val;
  nni_list_append(local_30,h);
  return;
}

Assistant:

void
nni_http_set_static_header(
    nng_http *conn, nni_http_header *h, const char *key, const char *val)
{
	nni_list *headers;
	if (conn->client) {
		headers = &conn->req.data.hdrs;
	} else {
		headers = &conn->res.data.hdrs;
	}

	nni_http_del_header(conn, key);
	nni_list_node_remove(&h->node);
	h->alloc_header = false;
	h->static_name  = true;
	h->static_value = true;
	h->name         = (char *) key;
	h->value        = (char *) val;
	nni_list_append(headers, h);
}